

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
          (TEST_GROUP_CppUTestGroupCommandLineArguments *this)

{
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest = (_func_int **)&PTR__Utest_003448c0;
  return;
}

Assistant:

TEST_GROUP(CommandLineArguments)
{
    CommandLineArguments* args;
    OptionsPlugin* plugin;

    void setup() _override
    {
        plugin = new OptionsPlugin("options");
        args = NULLPTR;
    }
    void teardown() _override
    {
        delete args;
        delete plugin;
    }

    bool newArgumentParser(int argc, const char *const *argv)
    {
        args = new CommandLineArguments(argc, argv);
        return args->parse(plugin);
    }
}